

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new_rowcol1(int a,int b)

{
  void *pvVar1;
  size_t _size_2;
  size_t _size_1;
  size_t _size;
  parasail_result_t *result;
  int b_local;
  int a_local;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_rowcol1");
    _b_local = (parasail_result_t *)0x0;
  }
  else {
    _b_local = parasail_result_new();
    if (_b_local == (parasail_result_t *)0x0) {
      _b_local = (parasail_result_t *)0x0;
    }
    else {
      pvVar1 = malloc(0x10);
      (_b_local->field_4).extra = pvVar1;
      if ((_b_local->field_4).extra == (void *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol1",0x10);
        _b_local = (parasail_result_t *)0x0;
      }
      else {
        pvVar1 = malloc((long)b << 2);
        ((_b_local->field_4).trace)->trace_table = pvVar1;
        if (((_b_local->field_4).rowcols)->score_row == (int *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol1",
                  (long)b << 2);
          _b_local = (parasail_result_t *)0x0;
        }
        else {
          pvVar1 = malloc((long)a << 2);
          ((_b_local->field_4).trace)->trace_ins_table = pvVar1;
          if (((_b_local->field_4).rowcols)->score_col == (int *)0x0) {
            fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol1",
                    (long)a << 2);
            _b_local = (parasail_result_t *)0x0;
          }
        }
      }
    }
  }
  return _b_local;
}

Assistant:

parasail_result_t* parasail_result_new_rowcol1(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    /* allocate only score col and row */
    PARASAIL_NEW(result->rowcols, parasail_result_extra_rowcols_t);
    PARASAIL_CALLOC(result->rowcols->score_row, int, b);
    PARASAIL_CALLOC(result->rowcols->score_col, int, a);

    return result;
}